

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

long CVariableInt::Decompress(void *pSrc_,int SrcSize,void *pDst_,int DstSize)

{
  uchar *puVar1;
  long lVar2;
  long lVar3;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/compression.cpp"
                 ,0x42,(uint)(((long)DstSize & 3U) == 0),"invalid bounds");
  puVar1 = (uchar *)((long)SrcSize + (long)pSrc_);
  for (lVar2 = 0;
      (lVar3 = lVar2, pSrc_ < puVar1 &&
      (lVar3 = -1,
      (int *)((long)pDst_ + lVar2) < (int *)(((long)DstSize & 0xfffffffffffffffcU) + (long)pDst_)));
      lVar2 = lVar2 + 4) {
    pSrc_ = Unpack((uchar *)pSrc_,(int *)((long)pDst_ + lVar2));
  }
  return lVar3;
}

Assistant:

long CVariableInt::Decompress(const void *pSrc_, int SrcSize, void *pDst_, int DstSize)
{
	dbg_assert(DstSize % sizeof(int) == 0, "invalid bounds");

	const unsigned char *pSrc = (unsigned char *)pSrc_;
	const unsigned char *pEnd = pSrc + SrcSize;
	int *pDst = (int *)pDst_;
	const int *pDstEnd = pDst + DstSize / sizeof(int);
	while(pSrc < pEnd)
	{
		if(pDst >= pDstEnd)
			return -1;
		pSrc = CVariableInt::Unpack(pSrc, pDst);
		pDst++;
	}
	return (long)((unsigned char *)pDst - (unsigned char *)pDst_);
}